

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

void Fossilize::Hashing::hash_pnext_struct
               (StateRecorder *param_1,Hasher *h,VkSamplerYcbcrConversionCreateInfo *info)

{
  VkSamplerYcbcrConversionCreateInfo *info_local;
  Hasher *h_local;
  StateRecorder *param_0_local;
  
  Hasher::u32(h,info->format);
  Hasher::u32(h,info->ycbcrModel);
  Hasher::u32(h,info->ycbcrRange);
  Hasher::u32(h,(info->components).r);
  Hasher::u32(h,(info->components).g);
  Hasher::u32(h,(info->components).b);
  Hasher::u32(h,(info->components).a);
  Hasher::u32(h,info->xChromaOffset);
  Hasher::u32(h,info->yChromaOffset);
  Hasher::u32(h,info->chromaFilter);
  Hasher::u32(h,info->forceExplicitReconstruction);
  return;
}

Assistant:

static void hash_pnext_struct(const StateRecorder *,
                              Hasher &h,
                              const VkSamplerYcbcrConversionCreateInfo &info)
{
	h.u32(info.format);
	h.u32(info.ycbcrModel);
	h.u32(info.ycbcrRange);
	h.u32(info.components.r);
	h.u32(info.components.g);
	h.u32(info.components.b);
	h.u32(info.components.a);
	h.u32(info.xChromaOffset);
	h.u32(info.yChromaOffset);
	h.u32(info.chromaFilter);
	h.u32(info.forceExplicitReconstruction);
}